

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::headerChangedSlot(QHttpThreadDelegate *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  qint64 qVar5;
  QHttpThreadDelegate *in_RDI;
  long in_FS_OFFSET;
  char *buf;
  QSharedPointer<char> *in_stack_ffffffffffffff48;
  QHttpThreadDelegate *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QString *in_stack_ffffffffffffff90;
  QHttpHeaders *in_stack_ffffffffffffff98;
  QHttpThreadDelegate *this_00;
  undefined1 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  int in_stack_ffffffffffffffac;
  qint64 in_stack_ffffffffffffffc0;
  qint64 in_stack_ffffffffffffffc8;
  undefined1 local_30 [8];
  QSharedPointer<char> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->httpReply != (QHttpNetworkReply *)0x0) {
    this_00 = in_RDI;
    if ((in_RDI->ssl & 1U) != 0) {
      QHttpNetworkReply::sslConfiguration
                ((QHttpNetworkReply *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
      ;
      sslConfigurationChanged
                (in_stack_ffffffffffffff50,(QSslConfiguration *)in_stack_ffffffffffffff48);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x30ff3e);
    }
    bVar1 = QHttpNetworkReply::supportsUserProvidedDownloadBuffer
                      ((QHttpNetworkReply *)in_stack_ffffffffffffff50);
    if (((bVar1) && (0 < in_RDI->downloadBufferMaximumSize)) &&
       (lVar3 = (**(code **)(*(long *)in_RDI->httpReply + 0x80))(),
       lVar3 <= in_RDI->downloadBufferMaximumSize)) {
      uVar4 = (**(code **)(*(long *)in_RDI->httpReply + 0x80))();
      in_stack_ffffffffffffff98 = (QHttpHeaders *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
      if (in_stack_ffffffffffffff98 != (QHttpHeaders *)0x0) {
        QSharedPointer<char>::
        QSharedPointer<char,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qhttpthreaddelegate_cpp:613:56),_true>
                  (&local_28,in_stack_ffffffffffffff98);
        QSharedPointer<char>::operator=
                  ((QSharedPointer<char> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (QSharedPointer<char> *)in_stack_ffffffffffffff50);
        QSharedPointer<char>::~QSharedPointer((QSharedPointer<char> *)0x30fff5);
        QHttpNetworkReply::setUserProvidedDownloadBuffer
                  ((QHttpNetworkReply *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
    }
    (**(code **)(*(long *)in_RDI->httpReply + 0x90))(local_30);
    QHttpHeaders::operator=
              ((QHttpHeaders *)in_stack_ffffffffffffff50,(QHttpHeaders *)in_stack_ffffffffffffff48);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x310050);
    iVar2 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x310061);
    in_RDI->incomingStatusCode = iVar2;
    QHttpNetworkReply::reasonPhrase
              ((QHttpNetworkReply *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QString::operator=((QString *)in_stack_ffffffffffffff50,(QString *)in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x31009f);
    bVar1 = QHttpNetworkReply::isPipeliningUsed((QHttpNetworkReply *)0x3100b0);
    in_RDI->isPipeliningUsed = bVar1;
    qVar5 = (**(code **)(*(long *)in_RDI->httpReply + 0x80))();
    in_RDI->incomingContentLength = qVar5;
    qVar5 = QHttpNetworkReply::removedContentLength((QHttpNetworkReply *)0x3100eb);
    in_RDI->removedContentLength = qVar5;
    bVar1 = QHttpNetworkReply::isHttp2Used((QHttpNetworkReply *)0x310106);
    in_RDI->isHttp2Used = bVar1;
    bVar1 = QHttpNetworkReply::isCompressed((QHttpNetworkReply *)in_stack_ffffffffffffff50);
    in_RDI->isCompressed = bVar1;
    QSharedPointer<char>::QSharedPointer
              ((QSharedPointer<char> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    downloadMetaData(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffffab,
                     (QSharedPointer<char> *)in_RDI,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffaa,
                     (bool)in_stack_ffffffffffffffa9);
    QSharedPointer<char>::~QSharedPointer((QSharedPointer<char> *)0x3101de);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::headerChangedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::headerChangedSlot() thread=" << QThread::currentThreadId();
#endif

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif

    // Is using a zerocopy buffer allowed by user and possible with this reply?
    if (httpReply->supportsUserProvidedDownloadBuffer()
        && (downloadBufferMaximumSize > 0) && (httpReply->contentLength() <= downloadBufferMaximumSize)) {
        char *buf = new (std::nothrow) char[httpReply->contentLength()];
        // in out of memory situations, don't use downloadBuffer.
        if (buf) {
            downloadBuffer = QSharedPointer<char>(buf, [](auto p) { delete[] p; });
            httpReply->setUserProvidedDownloadBuffer(buf);
        }
    }

    // We fetch this into our own
    incomingHeaders = httpReply->header();
    incomingStatusCode = httpReply->statusCode();
    incomingReasonPhrase = httpReply->reasonPhrase();
    isPipeliningUsed = httpReply->isPipeliningUsed();
    incomingContentLength = httpReply->contentLength();
    removedContentLength = httpReply->removedContentLength();
    isHttp2Used = httpReply->isHttp2Used();
    isCompressed = httpReply->isCompressed();

    emit downloadMetaData(incomingHeaders,
                          incomingStatusCode,
                          incomingReasonPhrase,
                          isPipeliningUsed,
                          downloadBuffer,
                          incomingContentLength,
                          removedContentLength,
                          isHttp2Used,
                          isCompressed);
}